

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

string * __thiscall
LTFlightData::FDStaticData::flightRoute_abi_cxx11_
          (string *__return_storage_ptr__,FDStaticData *this)

{
  size_type sVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  pointer pcVar5;
  _Alloc_hider _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string r;
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  route_abi_cxx11_(&local_38,this);
  sVar1 = (this->flight)._M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_38._M_string_length == 0) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_0016afe5;
    }
    pcVar5 = local_38._M_dataplus._M_p + local_38._M_string_length;
    _Var6._M_p = local_38._M_dataplus._M_p;
  }
  else {
    if (local_38._M_string_length != 0) {
      pcVar5 = (this->flight)._M_dataplus._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>((string *)local_58,pcVar5,pcVar5 + sVar1);
      std::__cxx11::string::append((char *)local_58);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_58,(ulong)local_38._M_dataplus._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar2 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      goto LAB_0016afe5;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var6._M_p = (this->flight)._M_dataplus._M_p;
    pcVar5 = _Var6._M_p + sVar1;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,_Var6._M_p,pcVar5);
LAB_0016afe5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LTFlightData::FDStaticData::flightRoute() const
{
    const std::string r(route());
    // keep it an empty string if there is no info at all
    if (flight.empty() && r.empty())
        return std::string();
    
    // if there is some info missing then just return the other
    if (flight.empty())
        return r;
    if (r.empty())
        return flight;
    
    // we have both...put it together
    return (flight + ": ") + r;
}